

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

void Zyx_ManPrintSolution(Zyx_Man_t *p,int fCompl,int fFirst)

{
  bmcg_sat_solver *pbVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  bool local_21;
  uint local_20;
  uint local_1c;
  int k;
  int i;
  int fFirst_local;
  int fCompl_local;
  Zyx_Man_t *p_local;
  
  pcVar4 = "LUTs";
  if (p->pPars->fMajority != 0) {
    pcVar4 = "MAJ-gates";
  }
  printf("Realization of given %d-input function using %d %d-input %s:\n",
         (ulong)(uint)p->pPars->nVars,(ulong)(uint)p->pPars->nNodes,(ulong)(uint)p->pPars->nLutSize,
         pcVar4);
  local_1c = p->nObjs;
  while (local_1c = local_1c - 1, p->pPars->nVars <= (int)local_1c) {
    printf("%02d = ",(ulong)local_1c);
    if (p->pPars->fMajority == 0) {
      printf("%d\'b",(ulong)(uint)(1 << ((byte)p->pPars->nLutSize & 0x1f)));
      for (local_20 = p->LutMask; -1 < (int)local_20; local_20 = local_20 + -1) {
        pbVar1 = p->pSat;
        iVar3 = Zyx_FuncVar(p,local_1c,local_20);
        uVar2 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar3);
        local_21 = local_1c == p->nObjs - 1U && fCompl != 0;
        printf("%d",(ulong)(uVar2 ^ local_21));
      }
    }
    else {
      printf("MAJ3");
    }
    printf("(");
    for (local_20 = 0; (int)local_20 < (int)local_1c; local_20 = local_20 + 1) {
      pbVar1 = p->pSat;
      iVar3 = Zyx_TopoVar(p,local_1c,local_20);
      iVar3 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar3);
      if (iVar3 != 0) {
        if (((int)local_20 < 0) || (p->pPars->nVars <= (int)local_20)) {
          printf(" %02d",(ulong)local_20);
        }
        else {
          printf(" %c",(ulong)(local_20 + 0x61));
        }
      }
    }
    printf(" )\n");
  }
  if (p->pPars->fMajority == 0) {
    Zyx_ManPrintSolutionFile(p,fCompl,fFirst);
  }
  return;
}

Assistant:

static void Zyx_ManPrintSolution( Zyx_Man_t * p, int fCompl, int fFirst )
{
    int i, k;
    printf( "Realization of given %d-input function using %d %d-input %s:\n", 
        p->pPars->nVars, p->pPars->nNodes, p->pPars->nLutSize, p->pPars->fMajority ? "MAJ-gates" : "LUTs" );
    for ( i = p->nObjs - 1; i >= p->pPars->nVars; i-- )
    {
        printf( "%02d = ", i );
        if ( p->pPars->fMajority )
            printf( "MAJ3" );
        else
        {
            printf( "%d\'b", 1 << p->pPars->nLutSize );
            for ( k = p->LutMask; k >= 0; k-- )
                printf( "%d", bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i, k)) ^ (i == p->nObjs - 1 && fCompl) );
        }
        printf( "(" );
        for ( k = 0; k < i; k++ )
            if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i, k)) )
            {
                if ( k >= 0 && k < p->pPars->nVars )
                    printf( " %c", 'a'+k );
                else
                    printf( " %02d", k );
            }
        printf( " )\n" );
    }
    if ( !p->pPars->fMajority )
        Zyx_ManPrintSolutionFile( p, fCompl, fFirst );
}